

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O0

size_t __thiscall ByteString::bits(ByteString *this)

{
  size_type sVar1;
  byte *pbVar2;
  long in_RDI;
  uchar mask;
  uchar byte;
  size_t i;
  size_t bits;
  byte local_22;
  ulong local_20;
  size_t local_18;
  size_t local_8;
  
  sVar1 = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)(in_RDI + 8));
  local_18 = sVar1 << 3;
  if (local_18 == 0) {
    local_8 = 0;
  }
  else {
    for (local_20 = 0;
        sVar1 = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)(in_RDI + 8)),
        local_20 < sVar1; local_20 = local_20 + 1) {
      pbVar2 = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)(in_RDI + 8),
                          local_20);
      for (local_22 = 0x80; local_22 != 0; local_22 = (byte)((int)(uint)local_22 >> 1)) {
        if ((*pbVar2 & local_22) != 0) {
          return local_18;
        }
        local_18 = local_18 - 1;
      }
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

size_t ByteString::bits() const
{
	size_t bits = byteString.size() * 8;

	if (bits == 0) return 0;

	for (size_t i = 0; i < byteString.size(); i++)
	{
		unsigned char byte = byteString[i];

		for (unsigned char mask = 0x80; mask > 0; mask >>= 1)
		{
			if ((byte & mask) == 0)
			{
				bits--;
			}
			else
			{
				return bits;
			}
		}
	}

	return bits;
}